

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmModuleGenerator::WasmModuleGenerator
          (WasmModuleGenerator *this,ScriptContext *scriptContext,WebAssemblySource *src)

{
  WebAssemblySource *scriptContext_00;
  uint binaryBufferLength;
  Recycler *pRVar1;
  Utf8SourceInfo *pUVar2;
  WebAssemblyModule *this_00;
  BYTE *binaryBuffer;
  JavascriptLibrary *this_01;
  DynamicType *type;
  SRCINFO *this_02;
  SourceContextInfo *this_03;
  TrackAllocData local_48;
  WebAssemblySource *local_20;
  WebAssemblySource *src_local;
  ScriptContext *scriptContext_local;
  WasmModuleGenerator *this_local;
  
  local_20 = src;
  src_local = (WebAssemblySource *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  pRVar1 = Js::ScriptContext::GetRecycler(scriptContext);
  this->m_recycler = pRVar1;
  pUVar2 = Js::WebAssemblySource::GetSourceInfo(local_20);
  this->m_sourceInfo = pUVar2;
  this->m_scriptContext = (ScriptContext *)src_local;
  pRVar1 = this->m_recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&Js::WebAssemblyModule::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
             ,0xf6);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this_00 = (WebAssemblyModule *)new<Memory::Recycler>(0xf0,pRVar1,0x4642b0);
  scriptContext_00 = src_local;
  binaryBuffer = Js::WebAssemblySource::GetBuffer(local_20);
  binaryBufferLength = Js::WebAssemblySource::GetBufferLength(local_20);
  this_01 = Js::ScriptContext::GetLibrary((ScriptContext *)src_local);
  type = Js::JavascriptLibrary::GetWebAssemblyModuleType(this_01);
  Js::WebAssemblyModule::WebAssemblyModule
            (this_00,(ScriptContext *)scriptContext_00,binaryBuffer,binaryBufferLength,type);
  this->m_module = this_00;
  Js::Utf8SourceInfo::EnsureInitialized(this->m_sourceInfo,0);
  this_02 = Js::Utf8SourceInfo::GetSrcInfo(this->m_sourceInfo);
  this_03 = Memory::WriteBarrierPtr<SourceContextInfo>::operator->(&this_02->sourceContextInfo);
  SourceContextInfo::EnsureInitialized(this_03);
  return;
}

Assistant:

WasmModuleGenerator::WasmModuleGenerator(Js::ScriptContext* scriptContext, Js::WebAssemblySource* src) :
    m_sourceInfo(src->GetSourceInfo()),
    m_scriptContext(scriptContext),
    m_recycler(scriptContext->GetRecycler())
{
    m_module = RecyclerNewFinalized(m_recycler, Js::WebAssemblyModule, scriptContext, src->GetBuffer(), src->GetBufferLength(), scriptContext->GetLibrary()->GetWebAssemblyModuleType());

    m_sourceInfo->EnsureInitialized(0);
    m_sourceInfo->GetSrcInfo()->sourceContextInfo->EnsureInitialized();
}